

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegRangePtr
xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom,int neg,xmlRegAtomType type,int start
                  ,int end,xmlChar *blockName)

{
  int iVar1;
  xmlRegRangePtr *ppxVar2;
  int newSize;
  xmlRegRangePtr *tmp;
  xmlRegRangePtr range;
  int end_local;
  int start_local;
  xmlRegAtomType type_local;
  int neg_local;
  xmlRegAtomPtr atom_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (atom == (xmlRegAtomPtr)0x0) {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"add range: atom is NULL");
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  else if (atom->type == XML_REGEXP_RANGES) {
    if (atom->maxRanges <= atom->nbRanges) {
      iVar1 = xmlGrowCapacity(atom->maxRanges,8,4,1000000000);
      if (iVar1 < 0) {
        xmlRegexpErrMemory(ctxt);
        return (xmlRegRangePtr)0x0;
      }
      ppxVar2 = (xmlRegRangePtr *)(*xmlRealloc)(atom->ranges,(long)iVar1 << 3);
      if (ppxVar2 == (xmlRegRangePtr *)0x0) {
        xmlRegexpErrMemory(ctxt);
        return (xmlRegRangePtr)0x0;
      }
      atom->ranges = ppxVar2;
      atom->maxRanges = iVar1;
    }
    ctxt_local = (xmlRegParserCtxtPtr)xmlRegNewRange(ctxt,neg,type,start,end);
    if (ctxt_local == (xmlRegParserCtxtPtr)0x0) {
      ctxt_local = (xmlRegParserCtxtPtr)0x0;
    }
    else {
      *(xmlChar **)&ctxt_local->error = blockName;
      iVar1 = atom->nbRanges;
      atom->nbRanges = iVar1 + 1;
      atom->ranges[iVar1] = (xmlRegRangePtr)ctxt_local;
    }
  }
  else {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"add range: atom is not ranges");
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  return (xmlRegRangePtr)ctxt_local;
}

Assistant:

static xmlRegRangePtr
xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom,
	           int neg, xmlRegAtomType type, int start, int end,
		   xmlChar *blockName) {
    xmlRegRangePtr range;

    if (atom == NULL) {
	ERROR("add range: atom is NULL");
	return(NULL);
    }
    if (atom->type != XML_REGEXP_RANGES) {
	ERROR("add range: atom is not ranges");
	return(NULL);
    }
    if (atom->nbRanges >= atom->maxRanges) {
	xmlRegRangePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(atom->maxRanges, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
        }
	tmp = xmlRealloc(atom->ranges, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	atom->ranges = tmp;
	atom->maxRanges = newSize;
    }
    range = xmlRegNewRange(ctxt, neg, type, start, end);
    if (range == NULL)
	return(NULL);
    range->blockName = blockName;
    atom->ranges[atom->nbRanges++] = range;

    return(range);
}